

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O2

double ON_SubDSectorType::CornerSectorAngleRadiansFromEdges
                 (ON_SubDEdgePtr sector_boundary_edge0_ptr,ON_SubDEdgePtr sector_boundary_edge1_ptr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double x;
  ON_3dVector B;
  ON_3dVector A;
  ON_3dVector local_60;
  ON_3dVector local_48;
  ON_3dVector local_30;
  
  uVar7 = sector_boundary_edge0_ptr.m_ptr & 0xfffffffffffffff8;
  uVar5 = sector_boundary_edge1_ptr.m_ptr & 0xfffffffffffffff8;
  if (uVar5 != 0 && uVar7 != 0) {
    if (uVar7 == uVar5) {
      pdVar6 = &MaximumCornerAngleRadians;
      goto LAB_0062aa75;
    }
    uVar9 = (uint)sector_boundary_edge0_ptr.m_ptr & 1;
    lVar1 = *(long *)(uVar7 + 0x80 + (ulong)(uVar9 ^ 1) * 8);
    if (lVar1 != 0) {
      uVar8 = (uint)sector_boundary_edge1_ptr.m_ptr & 1;
      lVar2 = *(long *)(uVar5 + 0x80 + (ulong)(uVar8 ^ 1) * 8);
      if (((lVar2 != 0) && (lVar3 = *(long *)(uVar7 + 0x80 + (ulong)uVar9 * 8), lVar3 != 0)) &&
         (lVar3 == *(long *)(uVar5 + 0x80 + (ulong)uVar8 * 8))) {
        ON_3dVector::ON_3dVector
                  (&local_30,*(double *)(lVar1 + 0x80) - *(double *)(lVar3 + 0x80),
                   *(double *)(lVar1 + 0x88) - *(double *)(lVar3 + 0x88),
                   *(double *)(lVar1 + 0x90) - *(double *)(lVar3 + 0x90));
        ON_3dVector::ON_3dVector
                  (&local_48,*(double *)(lVar2 + 0x80) - *(double *)(lVar3 + 0x80),
                   *(double *)(lVar2 + 0x88) - *(double *)(lVar3 + 0x88),
                   *(double *)(lVar2 + 0x90) - *(double *)(lVar3 + 0x90));
        ON_3dVector::Unitize(&local_30);
        ON_3dVector::Unitize(&local_48);
        dVar10 = ON_3dVector::operator*(&local_30,&local_48);
        ON_CrossProduct(&local_60,&local_30,&local_48);
        dVar11 = ON_3dVector::Length(&local_60);
        if (0.0 <= dVar11) {
          dVar12 = ABS(dVar10);
          dVar10 = (double)(~-(ulong)(dVar12 <= 0.002) & (ulong)dVar10);
          dVar13 = ABS(dVar11);
          dVar11 = (double)(~-(ulong)(dVar13 <= 0.002) & (ulong)dVar11);
          if (ABS(dVar10 * dVar10 + dVar11 * dVar11 + -1.0) <= 0.125) {
            x = 1.5707963267948966;
            if (((dVar10 != 0.0) || (NAN(dVar10))) && (dVar13 <= 0.002 || dVar13 < 0.999)) {
              if ((0.002 < dVar12 && 0.999 <= dVar12) || ((dVar11 == 0.0 && (!NAN(dVar11))))) {
                x = (double)(-(ulong)(dVar10 < 0.0) & 0x400921fb54442d18);
              }
              else {
                x = atan2(dVar11,dVar10);
                bVar4 = ON_IsValid(x);
                if (!bVar4) goto LAB_0062aa5b;
              }
            }
            if ((0.0 <= x) && (x <= 3.141592653589794)) {
              if (x <= 0.08726646259971647) {
                return 0.08726646259971647;
              }
              if (6.19591884457987 <= x) {
                return 6.19591884457987;
              }
              if (0.002 < ABS(x + -3.141592653589793)) {
                return x;
              }
              return 3.141592653589793;
            }
          }
        }
      }
    }
  }
LAB_0062aa5b:
  ON_SubDIncrementErrorCount();
  pdVar6 = &ErrorCornerSectorAngle;
LAB_0062aa75:
  return *pdVar6;
}

Assistant:

double ON_SubDSectorType::CornerSectorAngleRadiansFromEdges(
  ON_SubDEdgePtr sector_boundary_edge0_ptr,
  ON_SubDEdgePtr sector_boundary_edge1_ptr
  )
{
  const ON_SubDEdge* edges[2] = { ON_SUBD_EDGE_POINTER(sector_boundary_edge0_ptr.m_ptr), ON_SUBD_EDGE_POINTER(sector_boundary_edge1_ptr.m_ptr) };
  if (nullptr == edges[0] || nullptr == edges[1])
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);

  if (edges[0] == edges[1])
  {
    // occurs in nonmanifold cases like RH-49843
    // When an interior nonmanifold edge terminates a corner
    // and is the only crease edge is a sector for some
    // faces attached to the edge. 
    return ON_SubDSectorType::MaximumCornerAngleRadians;
    //return ON_SUBD_RETURN_ERROR(0.0);
  }

  ON__UINT_PTR edge_ends[2] = { ON_SUBD_EDGE_DIRECTION(sector_boundary_edge0_ptr.m_ptr), ON_SUBD_EDGE_DIRECTION(sector_boundary_edge1_ptr.m_ptr) };

  const ON_SubDVertex* V[2] = { edges[0]->m_vertex[1 - edge_ends[0]], edges[1]->m_vertex[1 - edge_ends[1]] };
  if (nullptr == V[0] || nullptr == V[1])
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);

  const ON_SubDVertex* corner_vertex = edges[0]->m_vertex[edge_ends[0]];
  if (nullptr == corner_vertex || corner_vertex != edges[1]->m_vertex[edge_ends[1]])
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);

  const double* cornerP = corner_vertex->m_P;

  const double* endP[2] = { V[0]->m_P, V[1]->m_P };

  // A = vector from cornerP to endP[0]
  ON_3dVector A(endP[0][0] - cornerP[0], endP[0][1] - cornerP[1], endP[0][2] - cornerP[2]);
  // B = vector from cornerP to endP[1]
  ON_3dVector B(endP[1][0] - cornerP[0], endP[1][1] - cornerP[1], endP[1][2] - cornerP[2]);

  // Unitize A and B
  A.Unitize();
  B.Unitize();

  // calculate angle between A and B
  // In reality, we will be lucky if we get 3 digits of precision in the trig functions
  // using the dot and cross of unitized differences.
  double cos_alpha = A*B;
  double sin_alpha = ON_CrossProduct(A, B).Length(); // NOTE WELL: sin_alpha >= 0.0 or is invalid
  if (sin_alpha < 0.0)
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);
  
  const double trig_zero_tol = 0.002;
  if (fabs(cos_alpha) <= trig_zero_tol)
    cos_alpha = 0.0;
  if (fabs(sin_alpha) <= trig_zero_tol)
    sin_alpha = 0.0;

  if ( fabs(cos_alpha*cos_alpha + sin_alpha*sin_alpha - 1.0) <= 0.125 )
  {
    // valid sin and cos and no NaNs
    const double trig_one_tol = 0.999;
    double alpha = ON_DBL_QNAN;

    if ( 0.0 == cos_alpha || fabs(sin_alpha) >= trig_one_tol)
      alpha = 0.5*ON_PI;
    else if ( 0.0 == sin_alpha || fabs(cos_alpha) >= trig_one_tol)
      alpha = (cos_alpha < 0.0) ? ON_PI : 0.0;
    else
    {
      alpha = atan2(sin_alpha, cos_alpha);

      // sin_alpha >= 0 and no NaNs means this should never happen
      if (!ON_IsValid(alpha))
        return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);
    }

    // sin_alpha >= 0 and no NaNs means this should always be true
    if (alpha >= 0.0 && alpha <= (1.0 + ON_EPSILON) * ON_PI)
    {
      if (alpha <= ON_SubDSectorType::MinimumCornerAngleRadians)
        alpha = ON_SubDSectorType::MinimumCornerAngleRadians;
      else if (alpha >= ON_SubDSectorType::MaximumCornerAngleRadians)
        alpha = ON_SubDSectorType::MaximumCornerAngleRadians;
      else if (fabs(alpha - ON_PI) <= 0.002)
      {
        // straight "corner"
        alpha = ON_PI;
      }

      return alpha;
    }
  }

  return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorCornerSectorAngle);
}